

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout_p.cpp
# Opt level: O3

void __thiscall
QtGraphicsAnchorLayout::SequentialAnchorData::calculateSizeHints(SequentialAnchorData *this)

{
  long lVar1;
  AnchorData **ppAVar2;
  long lVar3;
  long lVar4;
  AnchorVertex **ppAVar5;
  qreal qVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  qVar6 = 0.0;
  dVar7 = 0.0;
  (this->super_AnchorData).maxSize = 0.0;
  (this->super_AnchorData).minPrefSize = 0.0;
  (this->super_AnchorData).minSize = 0.0;
  (this->super_AnchorData).prefSize = 0.0;
  (this->super_AnchorData).maxPrefSize = 0.0;
  lVar1 = (this->m_edges).d.size;
  if (lVar1 == 0) {
    qVar6 = 0.0;
  }
  else {
    ppAVar2 = (this->m_edges).d.ptr;
    ppAVar5 = &(this->super_AnchorData).from;
    dVar8 = 0.0;
    lVar4 = 0;
    dVar9 = 0.0;
    dVar10 = 0.0;
    do {
      lVar3 = *(long *)((long)ppAVar2 + lVar4);
      if (*(AnchorVertex **)(lVar3 + 0x18) == *ppAVar5) {
        dVar8 = dVar8 + *(double *)(lVar3 + 0x28);
        (this->super_AnchorData).minSize = dVar8;
        qVar6 = qVar6 + *(double *)(lVar3 + 0x30);
        dVar7 = dVar7 + *(double *)(lVar3 + 0x38);
        dVar9 = dVar9 + *(double *)(lVar3 + 0x40);
        (this->super_AnchorData).minPrefSize = dVar9;
        dVar10 = dVar10 + *(double *)(lVar3 + 0x48);
        ppAVar5 = (AnchorVertex **)(lVar3 + 0x20);
      }
      else {
        ppAVar5 = (AnchorVertex **)(lVar3 + 0x18);
        dVar8 = dVar8 - *(double *)(lVar3 + 0x38);
        (this->super_AnchorData).minSize = dVar8;
        dVar9 = dVar9 - *(double *)(lVar3 + 0x48);
        qVar6 = qVar6 - *(double *)(lVar3 + 0x30);
        dVar7 = dVar7 - *(double *)(lVar3 + 0x28);
        (this->super_AnchorData).minPrefSize = dVar9;
        dVar10 = dVar10 - *(double *)(lVar3 + 0x40);
      }
      (this->super_AnchorData).prefSize = qVar6;
      (this->super_AnchorData).maxSize = dVar7;
      (this->super_AnchorData).maxPrefSize = dVar10;
      lVar4 = lVar4 + 8;
    } while (lVar1 << 3 != lVar4);
  }
  (this->super_AnchorData).sizeAtMinimum = qVar6;
  (this->super_AnchorData).sizeAtPreferred = qVar6;
  (this->super_AnchorData).sizeAtMaximum = qVar6;
  return;
}

Assistant:

void SequentialAnchorData::calculateSizeHints()
{
    minSize = 0;
    prefSize = 0;
    maxSize = 0;
    minPrefSize = 0;
    maxPrefSize = 0;

    AnchorVertex *prev = from;

    for (AnchorData *edge : m_edges) {
        const bool edgeIsForward = (edge->from == prev);
        if (edgeIsForward) {
            minSize += edge->minSize;
            prefSize += edge->prefSize;
            maxSize += edge->maxSize;
            minPrefSize += edge->minPrefSize;
            maxPrefSize += edge->maxPrefSize;
            prev = edge->to;
        } else {
            Q_ASSERT(prev == edge->to);
            minSize -= edge->maxSize;
            prefSize -= edge->prefSize;
            maxSize -= edge->minSize;
            minPrefSize -= edge->maxPrefSize;
            maxPrefSize -= edge->minPrefSize;
            prev = edge->from;
        }
    }

    // See comment in AnchorData::refreshSizeHints() about sizeAt* values
    sizeAtMinimum = prefSize;
    sizeAtPreferred = prefSize;
    sizeAtMaximum = prefSize;
}